

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CoverCrossSyntax *pCVar1;
  BumpAllocator *unaff_RBX;
  Token TVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  Token *in_stack_00000010;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_00000018;
  Token *in_stack_00000020;
  Token *in_stack_00000028;
  BumpAllocator *in_stack_00000098;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *in_stack_000000a0;
  BumpAllocator *in_stack_ffffffffffffff48;
  CoverageIffClauseSyntax *in_stack_ffffffffffffff50;
  CoverageIffClauseSyntax *local_90;
  NamedLabelSyntax *local_80;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(unaff_retaddr,unaff_RBX);
  if (((BumpAllocator *)((long)__fn + 0x50))->head == (Segment *)0x0) {
    local_80 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_80 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  TVar2 = parsing::Token::deepClone((Token *)in_stack_000000a0,in_stack_00000098);
  deepClone<slang::syntax::IdentifierNameSyntax>(in_stack_000000a0,in_stack_00000098);
  if (((BumpAllocator *)((long)__fn + 0xa0))->head == (Segment *)0x0) {
    local_90 = (CoverageIffClauseSyntax *)0x0;
  }
  else {
    local_90 = deepClone<slang::syntax::CoverageIffClauseSyntax>
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  parsing::Token::deepClone((Token *)in_stack_000000a0,in_stack_00000098);
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)unaff_retaddr,unaff_RBX);
  parsing::Token::deepClone((Token *)in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone((Token *)in_stack_000000a0,in_stack_00000098);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverCrossSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (NamedLabelSyntax **)local_80,(Token *)TVar2.info,TVar2._0_8_,
                      (CoverageIffClauseSyntax **)local_90,in_stack_00000010,in_stack_00000018,
                      in_stack_00000020,in_stack_00000028);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverCrossSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverCrossSyntax>(
        *deepClone(node.attributes, alloc),
        node.label ? deepClone(*node.label, alloc) : nullptr,
        node.cross.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        node.emptySemi.deepClone(alloc)
    );
}